

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ServerList.cpp
# Opt level: O1

void __thiscall RenX_ServerListPlugin::updateServerList(RenX_ServerListPlugin *this)

{
  string *this_00;
  Server *pSVar1;
  char cVar2;
  long lVar3;
  void *local_68;
  void *local_60;
  long local_58;
  string local_50;
  
  RenX::getCore();
  RenX::Core::getServers();
  this_00 = &this->m_server_list_json;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace_aux
            (this_00,0,(this->m_server_list_json)._M_string_length,1,'[');
  if (local_60 == local_68) {
    lVar3 = 0;
  }
  else {
    lVar3 = 0;
    do {
      pSVar1 = *(Server **)((long)local_68 + lVar3 * 8);
      cVar2 = RenX::Server::isConnected();
      if ((cVar2 != '\0') && (cVar2 = RenX::Server::isFullyConnected(), cVar2 != '\0')) {
        server_as_json_abi_cxx11_(&local_50,this,pSVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (this_00,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        lVar3 = lVar3 + 1;
        break;
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != (long)local_60 - (long)local_68 >> 3);
  }
  if (lVar3 != (long)local_60 - (long)local_68 >> 3) {
    do {
      pSVar1 = *(Server **)((long)local_68 + lVar3 * 8);
      cVar2 = RenX::Server::isConnected();
      if ((cVar2 != '\0') && (cVar2 = RenX::Server::isFullyConnected(), cVar2 != '\0')) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (this_00,',');
        server_as_json_abi_cxx11_(&local_50,this,pSVar1);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (this_00,local_50._M_dataplus._M_p,local_50._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != (long)local_60 - (long)local_68 >> 3);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
            (this_00,']');
  updateMetadata(this);
  if (local_68 != (void *)0x0) {
    operator_delete(local_68,local_58 - (long)local_68);
  }
  return;
}

Assistant:

void RenX_ServerListPlugin::updateServerList() {
	const auto& servers = RenX::getCore()->getServers();
	size_t index = 0;
	RenX::Server *server;

	// regenerate server_list_json

	m_server_list_json = '[';

	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			m_server_list_json += server_as_json(*server);

			++index;
			break;
		}
		++index;
	}
	while (index != servers.size()) {
		server = servers[index];
		if (server->isConnected() && server->isFullyConnected()) {
			m_server_list_json += ',';
			m_server_list_json += server_as_json(*server);
		}
		++index;
	}

	m_server_list_json += ']';

	// Also update metadata so that it reflects any changes
	updateMetadata();
}